

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRational.h
# Opt level: O3

Rational Imf_3_4::guessExactFps(Rational *fps)

{
  Rational RVar1;
  Rational RVar2;
  Rational RVar3;
  Rational RVar4;
  double dVar5;
  
  dVar5 = (double)fps->n / (double)fps->d;
  RVar1.n = 24000;
  RVar1.d = 0x3e9;
  if (ABS(dVar5 + -23.976023976023978) < 0.002) {
    return RVar1;
  }
  if (ABS(dVar5 + -29.97002997002997) < 0.002) {
    RVar2.n = 30000;
    RVar2.d = 0x3e9;
    return RVar2;
  }
  if (ABS(dVar5 + -47.952047952047955) < 0.002) {
    RVar3.n = 48000;
    RVar3.d = 0x3e9;
    return RVar3;
  }
  if (ABS(dVar5 + -59.94005994005994) < 0.002) {
    RVar4.n = 60000;
    RVar4.d = 0x3e9;
    return RVar4;
  }
  return *fps;
}

Assistant:

operator double () const { return double (n) / double (d); }